

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonASTNode.hpp
# Opt level: O2

void __thiscall CommonASTNode::~CommonASTNode(CommonASTNode *this)

{
  ~CommonASTNode(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~CommonASTNode()
		{}